

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_traceback(lua_State *L)

{
  lua_State *L_00;
  int32_t level;
  lua_State *L1_00;
  char *msg_00;
  char *msg;
  lua_State *L1;
  lua_State *plStack_10;
  int arg;
  lua_State *L_local;
  
  plStack_10 = L;
  L1_00 = getthread(L,(int *)((long)&L1 + 4));
  msg_00 = lua_tolstring(plStack_10,L1._4_4_ + 1,(size_t *)0x0);
  L_00 = plStack_10;
  if ((msg_00 == (char *)0x0) && (plStack_10->base + L1._4_4_ < plStack_10->top)) {
    plStack_10->top = plStack_10->base + (long)L1._4_4_ + 1;
  }
  else {
    level = lj_lib_optint(plStack_10,L1._4_4_ + 2,(uint)(plStack_10 == L1_00));
    luaL_traceback(L_00,L1_00,msg_00,level);
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_traceback)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *msg = lua_tostring(L, arg+1);
  if (msg == NULL && L->top > L->base+arg)
    L->top = L->base+arg+1;
  else
    luaL_traceback(L, L1, msg, lj_lib_optint(L, arg+2, (L == L1)));
  return 1;
}